

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O0

void reverselock_tests::reverselock_multiple_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  reverselock_multiple t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff628;
  std_string *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff638;
  const_string *in_stack_fffffffffffff650;
  const_string *msg;
  size_t in_stack_fffffffffffff658;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff660;
  unit_test_log_t *in_stack_fffffffffffff668;
  reverselock_multiple *this_01;
  undefined1 local_800 [408];
  undefined1 local_668 [408];
  reverselock_multiple local_4d0 [408];
  undefined1 local_338 [408];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [21])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [15])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [21])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [16])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::setup_conditional<reverselock_tests::reverselock_multiple>
            ((reverselock_multiple *)0x97f0bf);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  this_01 = local_4d0;
  memset(this_01,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [21])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [13])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  reverselock_multiple::test_method(this_01);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [21])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [19])in_stack_fffffffffffff630);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::teardown_conditional<reverselock_tests::reverselock_multiple>
            ((reverselock_multiple *)0x97f2dc);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  file = boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [21])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [15])in_stack_fffffffffffff630);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_multiple)
{
    Mutex mutex2;
    Mutex mutex;
    WAIT_LOCK(mutex2, lock2);
    WAIT_LOCK(mutex, lock);

    // Make sure undoing two locks succeeds
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
        REVERSE_LOCK(lock2);
        BOOST_CHECK(!lock2.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
    BOOST_CHECK(lock2.owns_lock());
}